

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O2

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  long lVar7;
  cmTarget *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  PolicyID id;
  bool bVar12;
  MessageType t;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  ulong uVar13;
  allocator local_201;
  uint local_200;
  uint local_1fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  uint local_1d0;
  string exename;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  __first._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current) < 0x21)
  {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&exename);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  std::__cxx11::string::string((string *)&exename,(string *)__first._M_current);
  bVar12 = false;
  bVar4 = false;
  local_200 = 0;
  local_1fc = 0;
  local_1d0 = 0;
  uVar13 = 0;
LAB_00343e38:
  do {
    uVar11 = (ulong)local_200;
    while( true ) {
      local_200 = (uint)uVar11;
      uVar11 = (ulong)local_1fc;
      do {
        local_1fc = (uint)uVar11;
        uVar11 = (ulong)local_1d0;
        do {
          uVar9 = uVar11;
          local_1d0 = (uint)uVar9;
          uVar11 = uVar13;
          do {
            uVar10 = uVar11;
            __first._M_current = __first._M_current + 1;
            uVar13 = uVar10 & 0xffffffff;
            if (__first._M_current ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00343f27;
            uVar11 = uVar10;
            bVar3 = std::operator==(__first._M_current,"WIN32");
            uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
          } while (bVar3);
          bVar3 = std::operator==(__first._M_current,"MACOSX_BUNDLE");
          uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
        } while (bVar3);
        bVar3 = std::operator==(__first._M_current,"EXCLUDE_FROM_ALL");
        uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      } while (bVar3);
      bVar3 = std::operator==(__first._M_current,"IMPORTED");
      if (bVar3) {
        bVar12 = true;
        goto LAB_00343e38;
      }
      if ((bVar12) && (bVar3 = std::operator==(__first._M_current,"GLOBAL"), bVar3)) break;
      bVar3 = std::operator==(__first._M_current,"ALIAS");
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      if (!bVar3) {
LAB_00343f27:
        bVar3 = cmGeneratorExpression::IsValidTargetName(&exename);
        if ((!bVar3) || (bVar3 = cmGlobalGenerator::IsReservedTarget(&exename), bVar3)) {
LAB_00343f47:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          PVar5 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
          if (2 < PVar5 - NEW) {
            if (PVar5 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&srclists,(cmPolicies *)0x25,id);
              poVar6 = std::operator<<((ostream *)&e,(string *)&srclists);
              std::operator<<(poVar6,"\n");
              std::__cxx11::string::~string((string *)&srclists);
              bVar3 = false;
              t = AUTHOR_WARNING;
              goto LAB_00343fb5;
            }
LAB_00344029:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            if (bVar12) goto LAB_00344046;
LAB_003440cf:
            if ((local_200 & 1) == 0) {
              _e = (pointer)local_198;
              local_198[0]._M_local_buf[0] = '\0';
              bVar4 = cmMakefile::EnforceUniqueName
                                ((this->super_cmCommand).Makefile,&exename,(string *)&e,false);
              if (bVar4) {
                std::__cxx11::string::~string((string *)&e);
                __last._M_current =
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__first._M_current != __last._M_current) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &srclists,__first,__last,(allocator_type *)&e);
                  pcVar8 = cmMakefile::AddExecutable
                                     ((this->super_cmCommand).Makefile,exename._M_dataplus._M_p,
                                      &srclists,(bool)((byte)local_1fc & 1));
                  if ((uVar10 & 1) != 0) {
                    std::__cxx11::string::string((string *)&e,"WIN32_EXECUTABLE",&local_201);
                    cmTarget::SetProperty(pcVar8,(string *)&e,"ON");
                    std::__cxx11::string::~string((string *)&e);
                  }
                  if ((uVar9 & 1) != 0) {
                    std::__cxx11::string::string((string *)&e,"MACOSX_BUNDLE",&local_201);
                    cmTarget::SetProperty(pcVar8,(string *)&e,"ON");
                    std::__cxx11::string::~string((string *)&e);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&srclists);
LAB_00344220:
                  bVar12 = true;
                  goto LAB_00344387;
                }
                std::__cxx11::string::string
                          ((string *)&e,
                           "called with incorrect number of arguments, no sources provided",
                           (allocator *)&srclists);
                cmCommand::SetError(&this->super_cmCommand,(string *)&e);
              }
              else {
                cmCommand::SetError(&this->super_cmCommand,(string *)&e);
              }
            }
            else {
              bVar12 = false;
LAB_003440d8:
              bVar3 = cmGeneratorExpression::IsValidTargetName(&exename);
              if (bVar3) {
                if ((local_1fc & 1) == 0) {
                  if ((!bVar12) && (!bVar4)) {
                    if ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start == 0x60) {
                      pcVar2 = ((__first._M_current)->_M_dataplus)._M_p;
                      pcVar1 = (this->super_cmCommand).Makefile;
                      std::__cxx11::string::string((string *)&e,pcVar2,(allocator *)&srclists);
                      bVar4 = cmMakefile::IsAlias(pcVar1,(string *)&e);
                      std::__cxx11::string::~string((string *)&e);
                      if (bVar4) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                        poVar6 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
                        poVar6 = std::operator<<(poVar6,(string *)&exename);
                        poVar6 = std::operator<<(poVar6,"\" because target \"");
                        poVar6 = std::operator<<(poVar6,pcVar2);
                        std::operator<<(poVar6,"\" is itself an ALIAS.");
                        std::__cxx11::stringbuf::str();
                        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
                      }
                      else {
                        pcVar1 = (this->super_cmCommand).Makefile;
                        std::__cxx11::string::string((string *)&e,pcVar2,(allocator *)&srclists);
                        pcVar8 = cmMakefile::FindTargetToUse(pcVar1,(string *)&e,true);
                        std::__cxx11::string::~string((string *)&e);
                        if (pcVar8 == (cmTarget *)0x0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                          poVar6 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
                          poVar6 = std::operator<<(poVar6,(string *)&exename);
                          poVar6 = std::operator<<(poVar6,"\" because target \"");
                          poVar6 = std::operator<<(poVar6,pcVar2);
                          std::operator<<(poVar6,"\" does not already exist.");
                          std::__cxx11::stringbuf::str();
                          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
                        }
                        else if (pcVar8->TargetTypeValue == EXECUTABLE) {
                          if (pcVar8->IsImportedTarget != true) {
                            pcVar1 = (this->super_cmCommand).Makefile;
                            std::__cxx11::string::string((string *)&e,pcVar2,(allocator *)&srclists)
                            ;
                            cmMakefile::AddAlias(pcVar1,&exename,(string *)&e);
                            std::__cxx11::string::~string((string *)&e);
                            goto LAB_00344220;
                          }
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                          poVar6 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
                          poVar6 = std::operator<<(poVar6,(string *)&exename);
                          poVar6 = std::operator<<(poVar6,"\" because target \"");
                          poVar6 = std::operator<<(poVar6,pcVar2);
                          std::operator<<(poVar6,"\" is IMPORTED.");
                          std::__cxx11::stringbuf::str();
                          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
                        }
                        else {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                          poVar6 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
                          poVar6 = std::operator<<(poVar6,(string *)&exename);
                          poVar6 = std::operator<<(poVar6,"\" because target \"");
                          poVar6 = std::operator<<(poVar6,pcVar2);
                          std::operator<<(poVar6,"\" is not an executable.");
                          std::__cxx11::stringbuf::str();
                          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
                        }
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                      std::operator<<((ostream *)&e,"ALIAS requires exactly one target argument.");
                      std::__cxx11::stringbuf::str();
                      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
                    }
                    goto LAB_003444c4;
                  }
                  std::__cxx11::string::string
                            ((string *)&e,"IMPORTED with ALIAS is not allowed.",
                             (allocator *)&srclists);
                  cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                }
                else {
                  std::__cxx11::string::string
                            ((string *)&e,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                             (allocator *)&srclists);
                  cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                }
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &e,"Invalid name for ALIAS: ",&exename);
                cmCommand::SetError(&this->super_cmCommand,(string *)&e);
              }
            }
            goto LAB_0034437b;
          }
          t = FATAL_ERROR;
          bVar3 = true;
LAB_00343fb5:
          poVar6 = std::operator<<((ostream *)&e,"The target name \"");
          poVar6 = std::operator<<(poVar6,(string *)&exename);
          std::operator<<(poVar6,
                          "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                         );
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,t,(string *)&srclists,false);
          std::__cxx11::string::~string((string *)&srclists);
          if (!bVar3) goto LAB_00344029;
LAB_0034401a:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
        else {
          if (!bVar12) {
            if (((local_200 & 1) == 0) &&
               (lVar7 = std::__cxx11::string::find((char *)&exename,0x4dc0b8), lVar7 != -1))
            goto LAB_00343f47;
            goto LAB_003440cf;
          }
LAB_00344046:
          if ((uVar10 & 1) == 0) {
            if ((uVar9 & 1) == 0) {
              if ((local_1fc & 1) == 0) {
                bVar12 = true;
                if ((local_200 & 1) != 0) goto LAB_003440d8;
                pcVar8 = cmMakefile::FindTargetToUse
                                   ((this->super_cmCommand).Makefile,&exename,false);
                if (pcVar8 == (cmTarget *)0x0) {
                  bVar12 = true;
                  cmMakefile::AddImportedTarget
                            ((this->super_cmCommand).Makefile,&exename,EXECUTABLE,bVar4);
                  goto LAB_00344387;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                poVar6 = std::operator<<((ostream *)&e,"cannot create imported target \"");
                poVar6 = std::operator<<(poVar6,(string *)&exename);
                std::operator<<(poVar6,
                                "\" because another target with the same name already exists.");
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
LAB_003444c4:
                std::__cxx11::string::~string((string *)&srclists);
                goto LAB_0034401a;
              }
              std::__cxx11::string::string
                        ((string *)&e,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",
                         (allocator *)&srclists);
              cmCommand::SetError(&this->super_cmCommand,(string *)&e);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&e,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                         (allocator *)&srclists);
              cmCommand::SetError(&this->super_cmCommand,(string *)&e);
            }
          }
          else {
            std::__cxx11::string::string
                      ((string *)&e,"may not be given WIN32 for an IMPORTED target.",
                       (allocator *)&srclists);
            cmCommand::SetError(&this->super_cmCommand,(string *)&e);
          }
LAB_0034437b:
          std::__cxx11::string::~string((string *)&e);
        }
        bVar12 = false;
LAB_00344387:
        std::__cxx11::string::~string((string *)&exename);
        return bVar12;
      }
    }
    bVar4 = true;
  } while( true );
}

Assistant:

bool cmAddExecutableCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while ( s != args.end() )
    {
    if (*s == "WIN32")
      {
      ++s;
      use_win32 = true;
      }
    else if ( *s == "MACOSX_BUNDLE" )
      {
      ++s;
      use_macbundle = true;
      }
    else if(*s == "EXCLUDE_FROM_ALL")
      {
      ++s;
      excludeFromAll = true;
      }
    else if(*s == "IMPORTED")
     {
     ++s;
     importTarget = true;
     }
    else if(importTarget && *s == "GLOBAL")
      {
      ++s;
      importGlobal = true;
      }
    else if(*s == "ALIAS")
      {
      ++s;
      isAlias = true;
      }
    else
      {
      break;
      }
    }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias)
    {
    nameOk = exename.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << exename <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // Special modifiers are not allowed with IMPORTED signature.
  if(importTarget
      && (use_win32 || use_macbundle || excludeFromAll))
    {
    if(use_win32)
      {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
      }
    else if(use_macbundle)
      {
      this->SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
      }
    else // if(excludeFromAll)
      {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
      }
    return false;
    }
  if (isAlias)
    {
    if(!cmGeneratorExpression::IsValidTargetName(exename))
      {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
      }
    if(excludeFromAll)
      {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
      }
    if(importTarget || importGlobal)
      {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
      }
    if(args.size() != 3)
      {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
      }

    const char *aliasedName = s->c_str();
    if(this->Makefile->IsAlias(aliasedName))
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
      }
    cmTarget *aliasedTarget =
                    this->Makefile->FindTargetToUse(aliasedName, true);
    if(!aliasedTarget)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" does not already "
        "exist.";
      this->SetError(e.str());
      return false;
      }
    cmState::TargetType type = aliasedTarget->GetType();
    if(type != cmState::EXECUTABLE)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is not an "
        "executable.";
      this->SetError(e.str());
      return false;
      }
    if(aliasedTarget->IsImported())
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
    }

  // Handle imported target creation.
  if(importTarget)
    {
    // Make sure the target does not already exist.
    if(this->Makefile->FindTargetToUse(exename))
      {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
      }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmState::EXECUTABLE,
                                      importGlobal);
    return true;
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(exename, msg))
    {
    this->SetError(msg);
    return false;
    }
  }

  if (s == args.end())
    {
    this->SetError
      ("called with incorrect number of arguments, no sources provided");
    return false;
    }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = this->Makefile->AddExecutable(exename.c_str(), srclists,
                                                excludeFromAll);
  if ( use_win32 )
    {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
    }
  if ( use_macbundle)
    {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
    }

  return true;
}